

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_multiplicative(t_parser *this,bool a_assignable)

{
  bool bVar1;
  t_token tVar2;
  t_at *ptVar3;
  t_binary *this_00;
  undefined7 in_register_00000031;
  long lVar4;
  undefined1 local_60 [16];
  t_at at;
  t_instruction local_30;
  t_instruction instruction;
  bool a_assignable_local;
  t_parser *this_local;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *node;
  
  lVar4 = CONCAT71(in_register_00000031,a_assignable);
  f_unary(this,a_assignable);
  do {
    bVar1 = t_lexer::f_newline((t_lexer *)(lVar4 + 8));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
              )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                )this;
    }
    tVar2 = t_lexer::f_token((t_lexer *)(lVar4 + 8));
    if (tVar2 == c_token__PERCENT) {
      local_30 = c_instruction__MODULUS_TT;
    }
    else if (tVar2 == c_token__ASTERISK) {
      local_30 = c_instruction__MULTIPLY_TT;
    }
    else {
      if (tVar2 != c_token__SLASH) {
        return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                  )this;
      }
      local_30 = c_instruction__DIVIDE_TT;
    }
    ptVar3 = t_lexer::f_at((t_lexer *)(lVar4 + 8));
    at.v_line = ptVar3->v_column;
    local_60._8_8_ = ptVar3->v_position;
    at.v_position = ptVar3->v_line;
    t_lexer::f_next((t_lexer *)(lVar4 + 8));
    this_00 = (t_binary *)operator_new(0x38);
    f_unary((t_parser *)local_60,a_assignable);
    ast::t_binary::t_binary
              (this_00,(t_at *)(local_60 + 8),local_30,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)this,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               local_60);
    std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::reset
              ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)this,
               (pointer)this_00);
    std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               local_60);
  } while( true );
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_multiplicative(bool a_assignable)
{
	auto node = f_unary(a_assignable);
	while (!v_lexer.f_newline()) {
		t_instruction instruction;
		switch (v_lexer.f_token()) {
		case t_lexer::c_token__ASTERISK:
			instruction = c_instruction__MULTIPLY_TT;
			break;
		case t_lexer::c_token__SLASH:
			instruction = c_instruction__DIVIDE_TT;
			break;
		case t_lexer::c_token__PERCENT:
			instruction = c_instruction__MODULUS_TT;
			break;
		default:
			return node;
		}
		t_at at = v_lexer.f_at();
		v_lexer.f_next();
		node.reset(new ast::t_binary(at, instruction, std::move(node), f_unary(false)));
	}
	return node;
}